

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletload_tests.cpp
# Opt level: O3

string * __thiscall
wallet::walletload_tests::DummyDescriptor::ToString_abi_cxx11_
          (string *__return_storage_ptr__,DummyDescriptor *this,bool compat_format)

{
  long lVar1;
  pointer pcVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (this->desc)._M_dataplus._M_p;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::string::_M_construct<char*>();
    return __return_storage_ptr__;
  }
  __stack_chk_fail(__return_storage_ptr__,pcVar2,pcVar2 + (this->desc)._M_string_length);
}

Assistant:

std::string ToString(bool compat_format) const override { return desc; }